

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char in_whitespace)

{
  jessilib *pjVar1;
  jessilib jVar2;
  jessilib *pjVar3;
  size_t sVar4;
  jessilib *pjVar5;
  jessilib *pjVar6;
  
  jVar2 = SUB81(end,0);
  if (begin <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  for (; (pjVar3 = (jessilib *)begin, this != (jessilib *)begin && (pjVar3 = this, *this == jVar2));
      this = this + 1) {
  }
  sVar4 = 0;
  while( true ) {
    if (pjVar3 + sVar4 == (jessilib *)begin) {
      (__return_storage_ptr__->first)._M_len = (long)begin - (long)pjVar3;
      (__return_storage_ptr__->first)._M_str = (char *)pjVar3;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
    if (pjVar3[sVar4] == jVar2) break;
    sVar4 = sVar4 + 1;
  }
  pjVar1 = pjVar3 + sVar4 + 1;
  do {
    pjVar5 = pjVar1;
    pjVar6 = (jessilib *)begin;
    if (pjVar5 == (jessilib *)begin) break;
    pjVar1 = pjVar5 + 1;
    pjVar6 = pjVar5;
  } while (*pjVar5 == jVar2);
  (__return_storage_ptr__->first)._M_len = sVar4;
  (__return_storage_ptr__->first)._M_str = (char *)pjVar3;
  (__return_storage_ptr__->second)._M_len = (long)begin - (long)pjVar6;
  (__return_storage_ptr__->second)._M_str = (char *)pjVar6;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}